

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double erlang_pdf(double x,double a,double b,int c)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar3 = 0.0;
  if (a < x) {
    dVar1 = (x - a) / b;
    dVar3 = pow(dVar1,(double)(c + -1));
    dVar2 = r8_factorial(c + -1);
    dVar1 = exp(dVar1);
    dVar3 = dVar3 / (dVar1 * dVar2 * b);
  }
  return dVar3;
}

Assistant:

double erlang_pdf ( double x, double a, double b, int c )

//****************************************************************************80
//
//  Purpose:
//
//    ERLANG_PDF evaluates the Erlang PDF.
//
//  Discussion:
//
//    PDF(A,B,C;X) = ( ( X - A ) / B )^( C - 1 )
//      / ( B * Gamma ( C ) * EXP ( ( X - A ) / B ) )
//
//    for 0 < B, 0 < C integer, A <= X.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    18 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//
//    Input, double A, B, int C, the parameters of the PDF.
//    0.0 < B.
//    0 < C.
//
//    Output, double ERLANG_PDF, the value of the PDF.
//
{
  double pdf;
  double y;

  if ( x <= a )
  {
    pdf = 0.0;
  }
  else
  {
    y = ( x - a ) / b;

    pdf = pow ( y, c - 1 ) / ( b * r8_factorial ( c - 1 ) * exp ( y ) );
  }

  return pdf;
}